

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::ListShaders<tinyusdz::UsdPrimvarReader<int>>
               (Stage *stage,PathShaderMap<tinyusdz::UsdPrimvarReader<int>_> *m)

{
  pointer pPVar1;
  Prim *root_prim;
  pointer prim;
  allocator local_51;
  string local_50;
  
  pPVar1 = (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (prim = (stage->_root_nodes).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start; prim != pPVar1; prim = prim + 1) {
    ::std::__cxx11::string::string((string *)&local_50,"",&local_51);
    (anonymous_namespace)::TraverseShaderRec<tinyusdz::UsdPrimvarReader<int>>(&local_50,prim,0,m);
    ::std::__cxx11::string::_M_dispose();
  }
  return true;
}

Assistant:

bool ListShaders(const tinyusdz::Stage &stage,
                 PathShaderMap<T> &m /* output */) {
  // Concrete Shader type(e.g. UsdPreviewSurface) is classified as Imaging
  // Should report error at compilation stege.
  static_assert((value::TypeId::TYPE_ID_IMAGING_BEGIN <=
                 value::TypeTraits<T>::type_id()) &&
                    (value::TypeId::TYPE_ID_IMAGING_END >
                     value::TypeTraits<T>::type_id()),
                "Not a Shader type.");

  // Check at runtime. Just in case...
  if ((value::TypeId::TYPE_ID_IMAGING_BEGIN <=
       value::TypeTraits<T>::type_id()) &&
      (value::TypeId::TYPE_ID_IMAGING_END > value::TypeTraits<T>::type_id())) {
    // Ok
  } else {
    return false;
  }

  for (const auto &root_prim : stage.root_prims()) {
    TraverseShaderRec(/* root path is empty */ "", root_prim, /* depth */ 0, m);
  }

  return true;
}